

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# raft_server.cxx
# Opt level: O2

ulong __thiscall nuraft::raft_server::term_for_log(raft_server *this,ulong log_idx)

{
  element_type *peVar1;
  bool bVar2;
  int iVar3;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  undefined4 extraout_var_01;
  ulong uVar4;
  int iVar5;
  element_type *peVar6;
  string local_50;
  ptr<snapshot> last_snapshot;
  
  if (log_idx == 0) {
    return 0;
  }
  iVar3 = (*((this->log_store_).super___shared_ptr<nuraft::log_store,_(__gnu_cxx::_Lock_policy)2>.
            _M_ptr)->_vptr_log_store[3])();
  if (CONCAT44(extraout_var,iVar3) <= log_idx) {
    peVar1 = (this->log_store_).super___shared_ptr<nuraft::log_store,_(__gnu_cxx::_Lock_policy)2>.
             _M_ptr;
    iVar3 = (*peVar1->_vptr_log_store[0xb])(peVar1,log_idx);
    return CONCAT44(extraout_var_00,iVar3);
  }
  (*((this->state_machine_).super___shared_ptr<nuraft::state_machine,_(__gnu_cxx::_Lock_policy)2>.
    _M_ptr)->_vptr_state_machine[0x10])(&last_snapshot);
  if ((last_snapshot.super___shared_ptr<nuraft::snapshot,_(__gnu_cxx::_Lock_policy)2>._M_ptr !=
       (element_type *)0x0) &&
     ((last_snapshot.super___shared_ptr<nuraft::snapshot,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->
      last_log_idx_ == log_idx)) {
    uVar4 = (last_snapshot.super___shared_ptr<nuraft::snapshot,_(__gnu_cxx::_Lock_policy)2>._M_ptr)
            ->last_log_term_;
    goto LAB_001acca2;
  }
  if ((term_for_log(unsigned_long)::bad_log_timer == '\0') &&
     (iVar3 = __cxa_guard_acquire(&term_for_log(unsigned_long)::bad_log_timer), iVar3 != 0)) {
    timer_helper::timer_helper(&term_for_log::bad_log_timer,1000000,true);
    __cxa_guard_release(&term_for_log(unsigned_long)::bad_log_timer);
  }
  bVar2 = timer_helper::timeout_and_reset(&term_for_log::bad_log_timer);
  peVar6 = (this->l_).super___shared_ptr<nuraft::logger,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
  if (peVar6 != (element_type *)0x0) {
    iVar3 = (**(code **)(*(long *)peVar6 + 0x38))();
    iVar5 = (uint)!bVar2 * 4 + 2;
    peVar6 = (this->l_).super___shared_ptr<nuraft::logger,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
    if (iVar5 <= iVar3) {
      msg_if_given_abi_cxx11_
                (&local_50,"bad log_idx %lu for retrieving the term value, will ignore this log req"
                 ,log_idx);
      (**(code **)(*(long *)peVar6 + 0x40))
                (peVar6,iVar5,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/greensky00[P]NuRaft/src/raft_server.cxx"
                 ,"term_for_log",0x601,&local_50);
      std::__cxx11::string::~string((string *)&local_50);
      peVar6 = (this->l_).super___shared_ptr<nuraft::logger,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
    }
    if (last_snapshot.super___shared_ptr<nuraft::snapshot,_(__gnu_cxx::_Lock_policy)2>._M_ptr !=
        (element_type *)0x0) {
      if (peVar6 == (element_type *)0x0) goto LAB_001acca0;
      iVar3 = (**(code **)(*(long *)peVar6 + 0x38))(peVar6);
      peVar6 = (this->l_).super___shared_ptr<nuraft::logger,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
      if (iVar5 <= iVar3) {
        msg_if_given_abi_cxx11_
                  (&local_50,"last snapshot %p, log_idx %lu, snapshot last_log_idx %lu\n",
                   last_snapshot.super___shared_ptr<nuraft::snapshot,_(__gnu_cxx::_Lock_policy)2>.
                   _M_ptr,log_idx,
                   (last_snapshot.super___shared_ptr<nuraft::snapshot,_(__gnu_cxx::_Lock_policy)2>.
                   _M_ptr)->last_log_idx_);
        (**(code **)(*(long *)peVar6 + 0x40))
                  (peVar6,iVar5,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/greensky00[P]NuRaft/src/raft_server.cxx"
                   ,"term_for_log",0x605,&local_50);
        std::__cxx11::string::~string((string *)&local_50);
        peVar6 = (this->l_).super___shared_ptr<nuraft::logger,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
      }
    }
    if ((peVar6 != (element_type *)0x0) &&
       (iVar3 = (**(code **)(*(long *)peVar6 + 0x38))(peVar6), iVar5 <= iVar3)) {
      peVar6 = (this->l_).super___shared_ptr<nuraft::logger,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
      iVar3 = (*((this->log_store_).
                 super___shared_ptr<nuraft::log_store,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->
                _vptr_log_store[3])();
      msg_if_given_abi_cxx11_
                (&local_50,"log_store_->start_index() %lu",CONCAT44(extraout_var_01,iVar3));
      (**(code **)(*(long *)peVar6 + 0x40))
                (peVar6,iVar5,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/greensky00[P]NuRaft/src/raft_server.cxx"
                 ,"term_for_log",0x607,&local_50);
      std::__cxx11::string::~string((string *)&local_50);
    }
  }
LAB_001acca0:
  uVar4 = 0;
LAB_001acca2:
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            (&last_snapshot.super___shared_ptr<nuraft::snapshot,_(__gnu_cxx::_Lock_policy)2>.
              _M_refcount);
  return uVar4;
}

Assistant:

ulong raft_server::term_for_log(ulong log_idx) {
    if (log_idx == 0) {
        return 0L;
    }

    if (log_idx >= log_store_->start_index()) {
        return log_store_->term_at(log_idx);
    }

    ptr<snapshot> last_snapshot(state_machine_->last_snapshot());
    if ( !last_snapshot || log_idx != last_snapshot->get_last_log_idx() ) {
        static timer_helper bad_log_timer(1000000, true);
        int log_lv = bad_log_timer.timeout_and_reset() ? L_ERROR : L_TRACE;

        p_lv(log_lv, "bad log_idx %" PRIu64 " for retrieving the term value, "
             "will ignore this log req", log_idx);
        if (last_snapshot) {
            p_lv(log_lv, "last snapshot %p, log_idx %" PRIu64
                 ", snapshot last_log_idx %" PRIu64 "\n",
                 last_snapshot.get(), log_idx, last_snapshot->get_last_log_idx());
        }
        p_lv(log_lv, "log_store_->start_index() %" PRIu64, log_store_->start_index());
        //ctx_->state_mgr_->system_exit(raft_err::N19_bad_log_idx_for_term);
        //::exit(-1);
        return 0L;
    }

    return last_snapshot->get_last_log_term();
}